

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateWrapperFieldGetterDocComment
               (Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  Descriptor *this;
  undefined1 is_descriptor;
  char *pcVar2;
  undefined1 in_R8B;
  string_view name;
  string_view value;
  string_view input;
  string_view local_160;
  string local_150;
  string_view local_130;
  string local_120;
  undefined1 local_100 [16];
  string local_f0;
  undefined1 local_d0 [16];
  string local_c0;
  string_view local_a0 [2];
  string_view local_80;
  string local_70;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  FieldDescriptor *local_20;
  FieldDescriptor *primitiveField;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  primitiveField = field;
  field_local = (FieldDescriptor *)printer;
  this = FieldDescriptor::message_type(field);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"value");
  local_20 = Descriptor::FindFieldByName(this,local_30);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"/**\n");
  protobuf::io::Printer::Print<>((Printer *)pFVar1,local_40);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50," * Returns the unboxed value from <code>get^camel_name^()</code>\n\n");
  local_80 = FieldDescriptor::name(primitiveField);
  name._M_str = (char *)0x1;
  name._M_len = (size_t)local_80._M_str;
  php::(anonymous_namespace)::UnderscoresToCamelCase_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)local_80._M_len,name,(bool)in_R8B);
  pcVar2 = "camel_name";
  protobuf::io::Printer::Print<char[11],std::__cxx11::string>
            ((Printer *)pFVar1,local_50,(char (*) [11])0x1f95a32,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  GenerateDocCommentBody<google::protobuf::FieldDescriptor>((Printer *)field_local,primitiveField);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_a0," * Generated from protobuf field <code>^def^</code>\n");
  FieldDescriptor::DebugString_abi_cxx11_(&local_120,primitiveField);
  local_100 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_120);
  value._M_len = local_100._8_8_;
  value._M_str = pcVar2;
  php::(anonymous_namespace)::FirstLineOf_abi_cxx11_(&local_f0,local_100._0_8_,value);
  local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_f0);
  input._M_len = local_d0._8_8_;
  input._M_str = pcVar2;
  php::(anonymous_namespace)::EscapePhpdoc_abi_cxx11_(&local_c0,local_d0._0_8_,input);
  is_descriptor = 0x48;
  protobuf::io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)pFVar1,local_a0[0],(char (*) [4])0x1f31348,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_120);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_130," * @return ^php_type^|null\n");
  php::(anonymous_namespace)::PhpGetterTypeName_abi_cxx11_
            (&local_150,(_anonymous_namespace_ *)local_20,(FieldDescriptor *)0x0,(bool)is_descriptor
            );
  protobuf::io::Printer::Print<char[9],std::__cxx11::string>
            ((Printer *)pFVar1,local_130,(char (*) [9])"php_type",&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  pFVar1 = field_local;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160," */\n");
  protobuf::io::Printer::Print<>((Printer *)pFVar1,local_160);
  return;
}

Assistant:

void GenerateWrapperFieldGetterDocComment(io::Printer* printer,
                                          const FieldDescriptor* field) {
  // Generate a doc comment for the special getXXXValue methods that are
  // generated for wrapper types.
  const FieldDescriptor* primitiveField =
      field->message_type()->FindFieldByName("value");
  printer->Print("/**\n");
  printer->Print(
      " * Returns the unboxed value from <code>get^camel_name^()</code>\n\n",
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  GenerateDocCommentBody(printer, field);
  printer->Print(" * Generated from protobuf field <code>^def^</code>\n", "def",
                 EscapePhpdoc(FirstLineOf(field->DebugString())));
  printer->Print(" * @return ^php_type^|null\n", "php_type",
                 PhpGetterTypeName(primitiveField, false));
  printer->Print(" */\n");
}